

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

CharClass * __thiscall duckdb_re2::CharClass::Negate(CharClass *this)

{
  uint *puVar1;
  CharClass *pCVar2;
  int iVar3;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = (ulong)*(int *)(this + 0x10);
  pCVar2 = (CharClass *)operator_new__(uVar8 * 8 + 0x20);
  *(CharClass **)(pCVar2 + 8) = pCVar2 + 0x18;
  *pCVar2 = *this;
  *(int *)(pCVar2 + 4) = 0x110000 - *(int *)(this + 4);
  if (uVar8 == 0) {
    uVar5 = 0;
    iVar3 = 0;
  }
  else {
    puVar4 = *(uint **)(this + 8);
    uVar5 = 0;
    iVar3 = 0;
    puVar6 = puVar4;
    do {
      if (*puVar4 != uVar5) {
        lVar7 = (long)iVar3;
        iVar3 = iVar3 + 1;
        *(ulong *)(*(long *)(pCVar2 + 8) + lVar7 * 8) = CONCAT44(*puVar4 - 1,uVar5);
        puVar6 = *(uint **)(this + 8);
        uVar8 = (ulong)*(uint *)(this + 0x10);
      }
      puVar1 = puVar4 + 1;
      uVar5 = *puVar1 + 1;
      puVar4 = puVar4 + 2;
    } while (puVar4 != puVar6 + (long)(int)uVar8 * 2);
    if (0x10fffe < (int)*puVar1) goto LAB_01c9ad87;
  }
  lVar7 = (long)iVar3;
  iVar3 = iVar3 + 1;
  *(ulong *)(*(long *)(pCVar2 + 8) + lVar7 * 8) = (ulong)uVar5 | 0x10ffff00000000;
LAB_01c9ad87:
  *(int *)(pCVar2 + 0x10) = iVar3;
  return pCVar2;
}

Assistant:

CharClass* CharClass::Negate() {
  CharClass* cc = CharClass::New(static_cast<size_t>(nranges_+1));
  cc->folds_ascii_ = folds_ascii_;
  cc->nrunes_ = Runemax + 1 - nrunes_;
  int n = 0;
  int nextlo = 0;
  for (CharClass::iterator it = begin(); it != end(); ++it) {
    if (it->lo == nextlo) {
      nextlo = it->hi + 1;
    } else {
      cc->ranges_[n++] = RuneRange(nextlo, it->lo - 1);
      nextlo = it->hi + 1;
    }
  }
  if (nextlo <= Runemax)
    cc->ranges_[n++] = RuneRange(nextlo, Runemax);
  cc->nranges_ = n;
  return cc;
}